

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SmallButton(char *label)

{
  bool bVar1;
  ImVec2 local_28;
  float local_1c;
  bool pressed;
  ImGuiContext *pIStack_18;
  float backup_padding_y;
  ImGuiContext *g;
  char *label_local;
  
  pIStack_18 = GImGui;
  local_1c = (GImGui->Style).FramePadding.y;
  (GImGui->Style).FramePadding.y = 0.0;
  g = (ImGuiContext *)label;
  ImVec2::ImVec2(&local_28,0.0,0.0);
  bVar1 = ButtonEx(label,&local_28,0x200);
  (pIStack_18->Style).FramePadding.y = local_1c;
  return bVar1;
}

Assistant:

bool ImGui::SmallButton(const char* label)
{
    ImGuiContext& g = *GImGui;
    float backup_padding_y = g.Style.FramePadding.y;
    g.Style.FramePadding.y = 0.0f;
    bool pressed = ButtonEx(label, ImVec2(0, 0), ImGuiButtonFlags_AlignTextBaseLine);
    g.Style.FramePadding.y = backup_padding_y;
    return pressed;
}